

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,string *base64)

{
  ByteData local_28;
  
  CryptoUtil::DecodeBase64(&local_28,(string *)base64);
  Psbt(this,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Psbt::Psbt(const std::string &base64)
    : Psbt(CryptoUtil::DecodeBase64(base64)) {
  // do nothing
}